

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

void Abc_ConvertAigToBdd_rec2(DdManager *dd,Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pObj_local;
  DdManager *dd_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0x2ed,"void Abc_ConvertAigToBdd_rec2(DdManager *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 != 0)) {
    pHVar2 = Hop_ObjFanin0(pObj);
    Abc_ConvertAigToBdd_rec2(dd,pHVar2);
    pHVar2 = Hop_ObjFanin1(pObj);
    Abc_ConvertAigToBdd_rec2(dd,pHVar2);
    Cudd_RecursiveDeref(dd,(DdNode *)(pObj->field_0).pData);
    (pObj->field_0).pData = (void *)0x0;
    iVar1 = Hop_ObjIsMarkA(pObj);
    if (iVar1 == 0) {
      __assert_fail("Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                    ,0x2f4,"void Abc_ConvertAigToBdd_rec2(DdManager *, Hop_Obj_t *)");
    }
    Hop_ObjClearMarkA(pObj);
  }
  return;
}

Assistant:

void Abc_ConvertAigToBdd_rec2( DdManager * dd, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || !Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToBdd_rec2( dd, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToBdd_rec2( dd, Hop_ObjFanin1(pObj) );
    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    pObj->pData = NULL;
    assert( Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjClearMarkA( pObj );
}